

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2etest.cc
# Opt level: O2

void * update_thread(void *args)

{
  size_t keylen;
  size_t valuelen;
  int iVar1;
  bool bVar2;
  timeval __test_begin;
  person_t p;
  timeval tStack_e48;
  person_t local_e34;
  
  gettimeofday(&tStack_e48,(__timezone_ptr_t)0x0);
  gen_person(&local_e34);
  iVar1 = 100000;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    keylen = strlen(local_e34.key);
    valuelen = strlen(local_e34.name);
    fdb_set_kv((fdb_kvs_handle *)args,&local_e34,keylen,local_e34.name,valuelen);
  }
  return (void *)0x0;
}

Assistant:

void *update_thread(void *args) {
    TEST_INIT();

    int i = 0, n=100000;
    person_t p;
    fdb_kvs_handle *kv = (fdb_kvs_handle *)args;

    // only generate 1 person type
    gen_person(&p);
    for (i = 0; i < n; ++i) {
        fdb_set_kv(kv, p.key, strlen(p.key),
                   p.name, strlen(p.name));
    }
    return NULL;
}